

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

int Ssc_GiaSimIsConst0(Gia_Man_t *p,int iObj0)

{
  int iVar1;
  word *pwVar2;
  word *pSim;
  int local_20;
  int nWords;
  int w;
  int iObj0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjSimWords(p);
  pwVar2 = Gia_ObjSim(p,iObj0);
  if ((*pwVar2 & 1) == 0) {
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      if (pwVar2[local_20] != 0) {
        return 0;
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      if (pwVar2[local_20] != 0xffffffffffffffff) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static inline int Ssc_GiaSimIsConst0( Gia_Man_t * p, int iObj0 )
{
    int w, nWords = Gia_ObjSimWords(p);
    word * pSim = Gia_ObjSim( p, iObj0 );
    if ( pSim[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( ~pSim[w] )
                return 0;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( pSim[w] )
                return 0;
    }
    return 1;
}